

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbank.cc
# Opt level: O2

int main(int argc,char **argv)

{
  InputOutputFormats input_format;
  double dVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined8 uVar6;
  ostream *poVar7;
  ostringstream *this;
  char *pcVar8;
  double *energy_00;
  double dVar9;
  double sampling_rate_00;
  allocator local_6d1;
  int local_6d0;
  int fft_length;
  InputOutputFormats local_6c8;
  int num_channel;
  string local_6c0;
  ulong local_6a0;
  double highest_frequency;
  double lowest_frequency;
  ulong local_688;
  double floor;
  double sampling_rate;
  ostringstream error_message_12;
  double energy;
  vector<double,_std::allocator<double>_> input;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  ifstream ifs;
  byte abStack_480 [488];
  WaveformToSpectrum waveform_to_spectrum;
  MelFilterBankAnalysis analysis;
  SpectrumToSpectrum spectrum_to_spectrum;
  Buffer buffer_for_spectral_analysis;
  
  num_channel = 0x14;
  fft_length = 0x100;
  lowest_frequency = 0.0;
  highest_frequency = 0.0;
  sampling_rate = 16.0;
  floor = 1.0;
  local_688 = 0;
  local_6d0 = 1;
  local_6c8 = kNumInputOutputFormats;
  local_6a0 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"n:l:s:L:H:q:o:e:h",(option *)0x0,(int *)0x0);
    input_format = local_6c8;
    switch(iVar5) {
    case 0x65:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&floor);
      bVar3 = floor <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -e option must be a positive number");
        std::__cxx11::string::string
                  ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
        sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
        goto LAB_00103e44;
      }
      break;
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x70:
    case 0x72:
switchD_00103734_caseD_66:
      anon_unknown.dwarf_2bf4::PrintUsage((ostream *)&std::cerr);
      return local_6d0;
    case 0x68:
      anon_unknown.dwarf_2bf4::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&fft_length);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be an integer");
        std::__cxx11::string::string
                  ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
        sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
        goto LAB_00103e44;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_channel);
      bVar3 = num_channel < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -n option must be a positive integer")
        ;
        std::__cxx11::string::string
                  ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
        sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
        goto LAB_00103e44;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&waveform_to_spectrum);
      if (bVar3) {
        bVar3 = sptk::IsInRange((InputOutputFormats)waveform_to_spectrum._vptr_WaveformToSpectrum,0,
                                1);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar3) {
          local_688 = (ulong)(InputOutputFormats)waveform_to_spectrum._vptr_WaveformToSpectrum;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ")
      ;
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      local_6d0 = 1;
      std::ostream::operator<<((ostream *)poVar7,1);
      std::__cxx11::string::string
                ((string *)&error_message_12,"fbank",(allocator *)&buffer_for_spectral_analysis);
      sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
      goto LAB_00103e44;
    case 0x71:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&waveform_to_spectrum);
      if (bVar3) {
        bVar3 = sptk::IsInRange((InputOutputFormats)waveform_to_spectrum._vptr_WaveformToSpectrum,0,
                                4);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar3) {
          local_6c8 = (InputOutputFormats)waveform_to_spectrum._vptr_WaveformToSpectrum;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -q option must be an integer ")
      ;
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,4);
      std::__cxx11::string::string
                ((string *)&error_message_12,"fbank",(allocator *)&buffer_for_spectral_analysis);
      sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
      goto LAB_00103e44;
    case 0x73:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&sampling_rate);
      bVar3 = sampling_rate <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -s option must be a positive number");
        std::__cxx11::string::string
                  ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
        sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
        goto LAB_00103e44;
      }
      break;
    default:
      if (iVar5 == 0x48) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
        bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&highest_frequency);
        bVar3 = highest_frequency <= 0.0;
        uVar6 = std::__cxx11::string::~string((string *)&ifs);
        local_6a0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
        if (!bVar2 || bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"The argument for the -H option must be a positive number"
                         );
          std::__cxx11::string::string
                    ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
          sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
LAB_00103e44:
          std::__cxx11::string::~string((string *)&error_message_12);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
          return local_6d0;
        }
      }
      else {
        if (iVar5 != 0x4c) {
          if (iVar5 != -1) goto switchD_00103734_caseD_66;
          sampling_rate_00 = sampling_rate * 1000.0;
          dVar9 = sampling_rate_00 * 0.5;
          dVar1 = dVar9;
          if (((local_6a0 & 1) != 0) && (dVar1 = highest_frequency, dVar9 < highest_frequency)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,
                            "Highest frequency must be less than or equal to Nyquist frequency");
            std::__cxx11::string::string
                      ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
            sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
            goto LAB_00103e44;
          }
          highest_frequency = dVar1;
          if (highest_frequency <= lowest_frequency) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Lowest frequency must be less than highest one");
            std::__cxx11::string::string
                      ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
            sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
            goto LAB_00103e44;
          }
          if (1 < argc - ya_optind) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Too many input files");
            std::__cxx11::string::string
                      ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
            sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
            goto LAB_00103e44;
          }
          if (argc == ya_optind) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar8 = argv[ya_optind];
          }
          bVar3 = sptk::SetBinaryMode();
          this = (ostringstream *)&ifs;
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream(this);
            std::operator<<((ostream *)this,"Cannot set translation mode");
            std::__cxx11::string::string
                      ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
            sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
            goto LAB_00103e44;
          }
          std::ifstream::ifstream(this);
          if ((pcVar8 != (char *)0x0) &&
             (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
             (abStack_480[*(long *)(_ifs + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
            poVar7 = std::operator<<((ostream *)&error_message_12,"Cannot open file ");
            std::operator<<(poVar7,pcVar8);
            std::__cxx11::string::string
                      ((string *)&waveform_to_spectrum,"fbank",
                       (allocator *)&buffer_for_spectral_analysis);
            sptk::PrintErrorMessage((string *)&waveform_to_spectrum,&error_message_12);
            std::__cxx11::string::~string((string *)&waveform_to_spectrum);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_12);
            local_6d0 = 1;
            goto LAB_00104506;
          }
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            this = (ostringstream *)&std::cin;
          }
          sptk::SpectrumToSpectrum::SpectrumToSpectrum
                    (&spectrum_to_spectrum,fft_length,input_format,kPowerSpectrum,0.0,
                     -1.79769313486232e+308);
          if ((input_format != kNumInputOutputFormats) && (spectrum_to_spectrum.is_valid_ == false))
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
            std::operator<<((ostream *)&error_message_12,
                            "Failed to set condition for input formatting");
            std::__cxx11::string::string
                      ((string *)&waveform_to_spectrum,"fbank",
                       (allocator *)&buffer_for_spectral_analysis);
            sptk::PrintErrorMessage((string *)&waveform_to_spectrum,&error_message_12);
            std::__cxx11::string::~string((string *)&waveform_to_spectrum);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_12);
            local_6d0 = 1;
            goto LAB_001044f9;
          }
          sptk::WaveformToSpectrum::WaveformToSpectrum
                    (&waveform_to_spectrum,fft_length,fft_length,kPowerSpectrum,0.0,
                     -1.79769313486232e+308);
          buffer_for_spectral_analysis._vptr_Buffer = (_func_int **)&PTR__Buffer_00115780;
          buffer_for_spectral_analysis.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_001157b0;
          buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
               (_func_int **)&PTR__Buffer_001157e0;
          memset(&buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_.
                  real_part_input_,0,0xa8);
          if ((input_format == kNumInputOutputFormats) &&
             (waveform_to_spectrum.filter_coefficients_to_spectrum_.is_valid_ == false)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
            std::operator<<((ostream *)&error_message_12,
                            "Failed to set condition for spectral analysis");
            std::__cxx11::string::string((string *)&analysis,"fbank",(allocator *)&local_6c0);
            sptk::PrintErrorMessage((string *)&analysis,&error_message_12);
            std::__cxx11::string::~string((string *)&analysis);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_12);
            local_6d0 = 1;
            goto LAB_001044df;
          }
          sptk::MelFilterBankAnalysis::MelFilterBankAnalysis
                    (&analysis,fft_length,num_channel,sampling_rate_00,lowest_frequency,
                     highest_frequency,floor,false);
          if (analysis.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
            std::operator<<((ostream *)&error_message_12,
                            "Failed to set condition for filter-bank analysis");
            std::__cxx11::string::string((string *)&local_6c0,"fbank",(allocator *)&input);
            sptk::PrintErrorMessage(&local_6c0,&error_message_12);
            std::__cxx11::string::~string((string *)&local_6c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_12);
            local_6d0 = 1;
            goto LAB_001044d2;
          }
          iVar5 = fft_length;
          if (input_format != kNumInputOutputFormats) {
            iVar5 = fft_length / 2 + 1;
          }
          local_6a0 = (ulong)num_channel;
          std::vector<double,_std::allocator<double>_>::vector
                    (&input,(long)iVar5,(allocator_type *)&error_message_12);
          std::vector<double,_std::allocator<double>_>::vector
                    (&processed_input,(long)(fft_length / 2 + 1),(allocator_type *)&error_message_12
                    );
          std::vector<double,_std::allocator<double>_>::vector
                    (&output,local_6a0,(allocator_type *)&error_message_12);
          energy_00 = &energy;
          if ((int)local_688 != 1) {
            energy_00 = (double *)0x0;
          }
          goto LAB_0010412d;
        }
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_12);
        bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&lowest_frequency);
        bVar3 = lowest_frequency < 0.0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar2 || bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -L option must be a ");
          std::operator<<(poVar7,"non-negative number");
          std::__cxx11::string::string
                    ((string *)&error_message_12,"fbank",(allocator *)&waveform_to_spectrum);
          sptk::PrintErrorMessage((string *)&error_message_12,(ostringstream *)&ifs);
          goto LAB_00103e44;
        }
      }
    }
  } while( true );
LAB_0010412d:
  do {
    bVar3 = sptk::ReadStream<double>(false,0,0,iVar5,&input,(istream *)this,(int *)0x0);
    if (!bVar3) {
      local_6d0 = 0;
      goto LAB_001044ab;
    }
    if (local_6c8 == kNumInputOutputFormats) {
      bVar3 = sptk::WaveformToSpectrum::Run
                        (&waveform_to_spectrum,&input,&processed_input,&buffer_for_spectral_analysis
                        );
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
        std::operator<<((ostream *)&error_message_12,"Failed to transform waveform to spectrum");
        std::__cxx11::string::string((string *)&local_6c0,"fbank",&local_6d1);
        sptk::PrintErrorMessage(&local_6c0,&error_message_12);
        goto LAB_00104490;
      }
    }
    else {
      bVar3 = sptk::SpectrumToSpectrum::Run(&spectrum_to_spectrum,&input,&processed_input);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
        std::operator<<((ostream *)&error_message_12,"Failed to convert spectrum");
        std::__cxx11::string::string((string *)&local_6c0,"fbank",&local_6d1);
        sptk::PrintErrorMessage(&local_6c0,&error_message_12);
        goto LAB_00104490;
      }
    }
    bVar3 = sptk::MelFilterBankAnalysis::Run(&analysis,&processed_input,&output,energy_00);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
      std::operator<<((ostream *)&error_message_12,"Failed to run mel-filter bank analysis");
      std::__cxx11::string::string((string *)&local_6c0,"fbank",&local_6d1);
      sptk::PrintErrorMessage(&local_6c0,&error_message_12);
      goto LAB_00104490;
    }
    bVar3 = sptk::WriteStream<double>(0,(int)local_6a0,&output,(ostream *)&std::cout,(int *)0x0);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
      std::operator<<((ostream *)&error_message_12,"Failed to write filter-bank output");
      std::__cxx11::string::string((string *)&local_6c0,"fbank",&local_6d1);
      sptk::PrintErrorMessage(&local_6c0,&error_message_12);
      goto LAB_00104490;
    }
  } while (((int)local_688 != 1) ||
          (bVar3 = sptk::WriteStream<double>(energy,(ostream *)&std::cout), bVar3));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_12);
  std::operator<<((ostream *)&error_message_12,"Failed to write energy");
  std::__cxx11::string::string((string *)&local_6c0,"fbank",&local_6d1);
  sptk::PrintErrorMessage(&local_6c0,&error_message_12);
LAB_00104490:
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_12);
  local_6d0 = 1;
LAB_001044ab:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&processed_input.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
LAB_001044d2:
  sptk::MelFilterBankAnalysis::~MelFilterBankAnalysis(&analysis);
LAB_001044df:
  sptk::WaveformToSpectrum::Buffer::~Buffer(&buffer_for_spectral_analysis);
  sptk::WaveformToSpectrum::~WaveformToSpectrum(&waveform_to_spectrum);
LAB_001044f9:
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&spectrum_to_spectrum);
LAB_00104506:
  std::ifstream::~ifstream(&ifs);
  return local_6d0;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_channel(kDefaultNumChannel);
  int fft_length(kDefaultFftLength);
  double sampling_rate(kDefaultSamplingRate);
  double lowest_frequency(kDefaultLowestFrequency);
  double highest_frequency(0.0);
  bool is_highest_frequency_specified(false);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  double floor(kDefaultFloor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "n:l:s:L:H:q:o:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_channel) ||
            num_channel <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lowest_frequency) ||
            lowest_frequency < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &highest_frequency) ||
            highest_frequency <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        is_highest_frequency_specified = true;
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &floor) || floor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (!is_highest_frequency_specified) {
    highest_frequency = 0.5 * sampling_rate_in_hz;
  } else if (0.5 * sampling_rate_in_hz < highest_frequency) {
    std::ostringstream error_message;
    error_message
        << "Highest frequency must be less than or equal to Nyquist frequency";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  if (highest_frequency <= lowest_frequency) {
    std::ostringstream error_message;
    error_message << "Lowest frequency must be less than highest one";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  sptk::MelFilterBankAnalysis analysis(fft_length, num_channel,
                                       sampling_rate_in_hz, lowest_frequency,
                                       highest_frequency, floor, false);
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for filter-bank analysis";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_channel);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double energy;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform != input_format) {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    } else {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      kFbankAndEnergy == output_format ? &energy : NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-filter bank analysis";
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write filter-bank output";
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }

    if (kFbankAndEnergy == output_format) {
      if (!sptk::WriteStream(energy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write energy";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    }
  }

  return 0;
}